

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<MyGame::Example::Monster>
          (FlatBufferBuilderImpl<false> *this,Offset<MyGame::Example::Monster> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_> OVar1;
  _TmpBuf __buf;
  _Iter_comp_iter<flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<MyGame::Example::Monster>_>
  local_48;
  _Temporary_buffer<flatbuffers::Offset<MyGame::Example::Monster>_*,_flatbuffers::Offset<MyGame::Example::Monster>_>
  local_40;
  
  if (len != 0) {
    std::
    _Temporary_buffer<flatbuffers::Offset<MyGame::Example::Monster>_*,_flatbuffers::Offset<MyGame::Example::Monster>_>
    ::_Temporary_buffer(&local_40,v,(long)((len - ((long)(len + 1) >> 0x3f)) + 1) >> 1);
    local_48._M_comp.buf_ =
         (TableKeyComparator<MyGame::Example::Monster>)
         (TableKeyComparator<MyGame::Example::Monster>)this;
    if (local_40._M_buffer == (Offset<MyGame::Example::Monster> *)0x0) {
      std::
      __inplace_stable_sort<flatbuffers::Offset<MyGame::Example::Monster>*,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<MyGame::Example::Monster>>>
                (v,v + len,&local_48);
    }
    else {
      std::
      __stable_sort_adaptive<flatbuffers::Offset<MyGame::Example::Monster>*,flatbuffers::Offset<MyGame::Example::Monster>*,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<MyGame::Example::Monster>>>
                (v,v + len,local_40._M_buffer,local_40._M_len,&local_48);
    }
    operator_delete(local_40._M_buffer,local_40._M_len << 2);
  }
  OVar1 = CreateVector<MyGame::Example::Monster>(this,v,len);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVectorOfSortedTables(Offset<T> *v,
                                                       size_t len) {
    std::stable_sort(v, v + len, TableKeyComparator<T>(buf_));
    return CreateVector(v, len);
  }